

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib558.c
# Opt level: O2

int test(char *URL)

{
  int iVar1;
  long lVar2;
  uchar a [14];
  
  a[8] = 0xa2;
  a[9] = 0xb3;
  a[10] = 0xc4;
  a[0xb] = 0xd5;
  a[0xc] = 0xe6;
  a[0xd] = 0xf7;
  a[0] = '/';
  a[1] = ':';
  a[2] = ';';
  a[3] = '<';
  a[4] = '=';
  a[5] = '>';
  a[6] = '?';
  a[7] = 0x91;
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    iVar1 = 0;
    lVar2 = curl_easy_escape(0,a,0xe);
    if (lVar2 != 0) {
      curl_free(lVar2);
    }
    curl_global_cleanup();
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    iVar1 = 0x7e;
  }
  return iVar1;
}

Assistant:

int test(char *URL)
{
  unsigned char a[] = {0x2f, 0x3a, 0x3b, 0x3c, 0x3d, 0x3e, 0x3f,
                       0x91, 0xa2, 0xb3, 0xc4, 0xd5, 0xe6, 0xf7};
  CURLcode res = CURLE_OK;
  char *ptr = NULL;
  int asize;

  (void)URL; /* we don't use this */

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  ptr = malloc(558);
  Curl_safefree(ptr);

  asize = (int)sizeof(a);
  ptr = curl_easy_escape(NULL, (char *)a, asize);
  if(ptr)
    curl_free(ptr);

  curl_global_cleanup();

  return (int)res;
}